

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_panel.cxx
# Opt level: O1

Fl_Double_Window * make_template_panel(void)

{
  uint *puVar1;
  Fl_Double_Window *pFVar2;
  Fl_Browser *this;
  Fl_Box *this_00;
  Fl_Group *pFVar3;
  Fl_Input *pFVar4;
  Fl_Button *pFVar5;
  Fl_Widget *this_01;
  Fl_Group *pFVar6;
  Fl_Return_Button *this_02;
  
  pFVar2 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar2,0x1cc,0x163,"New/Save Template");
  template_panel = pFVar2;
  (pFVar2->super_Fl_Window).super_Fl_Group.super_Fl_Widget.callback_ = cb_template_panel;
  this = (Fl_Browser *)operator_new(0x2a0);
  Fl_Browser::Fl_Browser(this,10,0x1c,0xb4,0xfa,"Available Templates:");
  template_browser = this;
  (this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.type_ = '\x02';
  (this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.label_.font = 1;
  (this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.callback_ = cb_template_browser;
  (this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.label_.align_ = 5;
  (this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.when_ = '\x03';
  this_00 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(this_00,200,0x1c,0xfa,0xfa,(char *)0x0);
  template_preview = this_00;
  (this_00->super_Fl_Widget).box_ = '\a';
  (this_00->super_Fl_Widget).label_.align_ = 0x55;
  pFVar3 = Fl_Group::current();
  pFVar3->resizable_ = &template_preview->super_Fl_Widget;
  pFVar4 = (Fl_Input *)operator_new(200);
  Fl_Input::Fl_Input(pFVar4,0xc6,0x120,0xfc,0x19,"Template Name:");
  template_name = pFVar4;
  (pFVar4->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar4->super_Fl_Input_).textfont_ = 4;
  (pFVar4->super_Fl_Input_).super_Fl_Widget.callback_ = cb_template_name;
  (pFVar4->super_Fl_Input_).super_Fl_Widget.when_ = '\x03';
  pFVar4 = (Fl_Input *)operator_new(200);
  Fl_Input::Fl_Input(pFVar4,0xc6,0x120,0xfc,0x19,"Instance Name:");
  template_instance = pFVar4;
  (pFVar4->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar4->super_Fl_Input_).textfont_ = 4;
  (*(pFVar4->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[6])(pFVar4);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0x143,0x1b8,0x19,(char *)0x0);
  pFVar5 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar5,10,0x143,0x8f,0x19,"Delete Template");
  template_delete = pFVar5;
  (pFVar5->super_Fl_Widget).callback_ = template_delete_cb;
  this_01 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)this_01,0x99,0x143,0x7e,0x19,(char *)0x0);
  pFVar6 = Fl_Group::current();
  pFVar6->resizable_ = this_01;
  pFVar5 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar5,0x121,0x143,0x48,0x19,"Cancel");
  (pFVar5->super_Fl_Widget).callback_ = cb_Cancel;
  this_02 = (Fl_Return_Button *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button(this_02,0x173,0x143,0x4f,0x19,"Save");
  template_submit = this_02;
  (this_02->super_Fl_Button).super_Fl_Widget.callback_ = cb_template_submit;
  Fl_Group::end(pFVar3);
  pFVar2 = template_panel;
  puVar1 = &(template_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x4000;
  Fl_Group::end((Fl_Group *)pFVar2);
  return template_panel;
}

Assistant:

Fl_Double_Window* make_template_panel() {
  { template_panel = new Fl_Double_Window(460, 355, "New/Save Template");
    template_panel->callback((Fl_Callback*)cb_template_panel);
    { template_browser = new Fl_Browser(10, 28, 180, 250, "Available Templates:");
      template_browser->type(2);
      template_browser->labelfont(1);
      template_browser->callback((Fl_Callback*)cb_template_browser);
      template_browser->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      template_browser->when(3);
    } // Fl_Browser* template_browser
    { template_preview = new Fl_Box(200, 28, 250, 250);
      template_preview->box(FL_THIN_DOWN_BOX);
      template_preview->align(Fl_Align(69|FL_ALIGN_INSIDE));
      Fl_Group::current()->resizable(template_preview);
    } // Fl_Box* template_preview
    { template_name = new Fl_Input(198, 288, 252, 25, "Template Name:");
      template_name->labelfont(1);
      template_name->textfont(4);
      template_name->callback((Fl_Callback*)cb_template_name);
      template_name->when(3);
    } // Fl_Input* template_name
    { template_instance = new Fl_Input(198, 288, 252, 25, "Instance Name:");
      template_instance->labelfont(1);
      template_instance->textfont(4);
      template_instance->hide();
    } // Fl_Input* template_instance
    { Fl_Group* o = new Fl_Group(10, 323, 440, 25);
      { template_delete = new Fl_Button(10, 323, 143, 25, "Delete Template");
        template_delete->callback((Fl_Callback*)template_delete_cb);
      } // Fl_Button* template_delete
      { Fl_Box* o = new Fl_Box(153, 323, 126, 25);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      { Fl_Button* o = new Fl_Button(289, 323, 72, 25, "Cancel");
        o->callback((Fl_Callback*)cb_Cancel);
      } // Fl_Button* o
      { template_submit = new Fl_Return_Button(371, 323, 79, 25, "Save");
        template_submit->callback((Fl_Callback*)cb_template_submit);
      } // Fl_Return_Button* template_submit
      o->end();
    } // Fl_Group* o
    template_panel->set_modal();
    template_panel->end();
  } // Fl_Double_Window* template_panel
  return template_panel;
}